

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O2

float deqp::gls::anon_unknown_0::getWellBehavingChannelColor(float v,int numBits)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (((v < 1.0) && (0.0 < v)) && (numBits != 0)) {
    fVar6 = (float)~(-1 << ((char)numBits + 3U & 0x1f));
    fVar5 = v * fVar6;
    uVar1 = (ulong)(fVar5 + *(float *)(&DAT_017c9790 + (ulong)(fVar5 < 0.0) * 4));
    uVar2 = (ulong)((uint)uVar1 & 7);
    uVar4 = 5;
    if (uVar2 != 4) {
      uVar4 = uVar2;
    }
    uVar3 = 2;
    if (uVar2 != 3) {
      uVar3 = uVar4;
    }
    v = (float)(uVar3 | uVar1 & 0xfffffffffffffff8) / fVar6;
  }
  return v;
}

Assistant:

static float getWellBehavingChannelColor (float v, int numBits)
{
	DE_ASSERT(de::inRange(numBits, 0, 32));

	// clear color may not be accurately representable in the target format. If the clear color is
	// on a representable value mapping range border, it could be rounded differently by the GL and in
	// SGLR adding an unexpected error source. However, selecting an accurately representable background
	// color would effectively disable dithering. To allow dithering and to prevent undefined rounding
	// direction from affecting results, round accurate color to target color format with 8 sub-units
	// (3 bits). If the selected sub-unit value is 3 or 4 (bordering 0.5), replace it with 2 and 5,
	// respectively.

	if (numBits == 0 || v <= 0.0f || v >= 1.0f)
	{
		// already accurately representable
		return v;
	}
	else
	{
		const deUint64 numSubBits		= 3;
		const deUint64 subUnitBorderLo	= (1u << (numSubBits - 1u)) - 1u;
		const deUint64 subUnitBorderHi	= 1u << (numSubBits - 1u);
		const deUint64 maxFixedValue	= (1u << (numBits + numSubBits)) - 1u;
		const deUint64 fixedValue		= deRoundFloatToInt64(v * (float)maxFixedValue);

		const deUint64 units			= fixedValue >> numSubBits;
		const deUint64 subUnits			= fixedValue & ((1u << numSubBits) - 1u);

		const deUint64 tweakedSubUnits	= (subUnits == subUnitBorderLo) ? (subUnitBorderLo - 1)
										: (subUnits == subUnitBorderHi) ? (subUnitBorderHi + 1)
										: (subUnits);
		const deUint64 tweakedValue		= (units << numSubBits) | (tweakedSubUnits);

		return float(tweakedValue) / float(maxFixedValue);
	}
}